

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_2::ContainsInvalidBool
               (ValidationState_t *_,Instruction *storage,bool skip_builtin)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar4;
  _Base_ptr p_Var5;
  Instruction *storage_00;
  size_t member_type_index;
  ulong index;
  bool bVar6;
  
  index = 1;
  while( true ) {
    if (skip_builtin) {
      psVar4 = ValidationState_t::id_decorations(_,(storage->inst_).result_id);
      for (p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        if (p_Var5[1]._M_color == 0xb) goto LAB_0017f06a;
      }
    }
    uVar1 = (storage->inst_).opcode;
    if (0x1e < uVar1) goto LAB_0017f06a;
    if ((0x31800000U >> (uVar1 & 0x1f) & 1) == 0) break;
    uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,1);
    storage = ValidationState_t::FindDef(_,uVar3);
  }
  if (uVar1 == 0x14) {
    bVar6 = true;
  }
  else if (uVar1 == 0x1e) {
    do {
      bVar6 = index < (ulong)((long)(storage->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(storage->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (!bVar6) {
        return bVar6;
      }
      uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,index);
      storage_00 = ValidationState_t::FindDef(_,uVar3);
      bVar2 = ContainsInvalidBool(_,storage_00,skip_builtin);
      index = index + 1;
    } while (!bVar2);
  }
  else {
LAB_0017f06a:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ContainsInvalidBool(ValidationState_t& _, const Instruction* storage,
                         bool skip_builtin) {
  if (skip_builtin) {
    for (const Decoration& decoration : _.id_decorations(storage->id())) {
      if (decoration.dec_type() == spv::Decoration::BuiltIn) return false;
    }
  }

  const size_t elem_type_index = 1;
  uint32_t elem_type_id;
  Instruction* elem_type;

  switch (storage->opcode()) {
    case spv::Op::OpTypeBool:
      return true;
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      elem_type_id = storage->GetOperandAs<uint32_t>(elem_type_index);
      elem_type = _.FindDef(elem_type_id);
      return ContainsInvalidBool(_, elem_type, skip_builtin);
    case spv::Op::OpTypeStruct:
      for (size_t member_type_index = 1;
           member_type_index < storage->operands().size();
           ++member_type_index) {
        auto member_type_id =
            storage->GetOperandAs<uint32_t>(member_type_index);
        auto member_type = _.FindDef(member_type_id);
        if (ContainsInvalidBool(_, member_type, skip_builtin)) return true;
      }
    default:
      break;
  }
  return false;
}